

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

bool check_fileext(path *filepath,string *fileext)

{
  __type _Var1;
  int iVar2;
  size_type sVar3;
  string ext;
  string local_68;
  path local_48;
  
  std::filesystem::__cxx11::path::extension(&local_48,filepath);
  std::filesystem::__cxx11::path::string(&local_68,&local_48);
  std::filesystem::__cxx11::path::~path(&local_48);
  for (sVar3 = 0; local_68._M_string_length != sVar3; sVar3 = sVar3 + 1) {
    iVar2 = tolower((int)local_68._M_dataplus._M_p[sVar3]);
    local_68._M_dataplus._M_p[sVar3] = (char)iVar2;
  }
  _Var1 = std::operator==(&local_68,fileext);
  std::__cxx11::string::~string((string *)&local_68);
  return _Var1;
}

Assistant:

bool check_fileext(const filesystem::path &filepath, const std::string fileext) {
	std::string ext{filepath.extension().string()}; // extract file ext
	std::transform(ext.begin(), ext.end(), ext.begin(), ::tolower);                 // make ext lowercase
	return ext == fileext;
}